

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * parser::nonTerminalName
                   (string *__return_storage_ptr__,NonTerminal nonTerminal,
                   NonTerminalNames *nonTerminalNames)

{
  const_iterator cVar1;
  stringstream stringstream;
  NonTerminal local_19c;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  local_19c = nonTerminal;
  cVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&nonTerminalNames->_M_t,&local_19c);
  if ((_Rb_tree_header *)cVar1._M_node == &(nonTerminalNames->_M_t)._M_impl.super__Rb_tree_header) {
    std::__cxx11::stringstream::stringstream(local_198);
    std::ostream::operator<<(local_188,local_19c);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_198);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&cVar1._M_node[1]._M_parent);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string nonTerminalName(NonTerminal nonTerminal, NonTerminalNames const& nonTerminalNames) {
        NonTerminalNames::const_iterator it = nonTerminalNames.find(nonTerminal);
        if (it == nonTerminalNames.end()) {
            std::stringstream stringstream;
            stringstream << nonTerminal;
            return stringstream.str();
        }
        return it->second;
    }